

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

String * axl::io::concatFilePath(String *filePath,StringRef *fileName)

{
  bool bVar1;
  size_t sVar2;
  C *pCVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  char last;
  StringRef *in_stack_ffffffffffffffc8;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *src;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  char cVar4;
  
  src = in_RDI;
  bVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RSI);
  if (bVar1) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
              (in_RDI,in_stack_ffffffffffffffc8);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
               CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),src);
  }
  else {
    sVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLength(in_RSI);
    pCVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator[]
                       (in_RSI,sVar2 - 1);
    cVar4 = *pCVar3;
    if (cVar4 != '/') {
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::append
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                 CONCAT17(cVar4,in_stack_ffffffffffffffe0),(utf32_t)((ulong)src >> 0x20));
    }
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::append(in_RDI,in_RSI);
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
               CONCAT17(cVar4,in_stack_ffffffffffffffe0),src);
  }
  return src;
}

Assistant:

sl::String
concatFilePath(
	sl::String* filePath,
	const sl::StringRef& fileName
) {
	if (filePath->isEmpty()) {
		*filePath = fileName;
		return *filePath;
	}

	char last = (*filePath) [filePath->getLength() - 1];

#if (_AXL_OS_WIN)
	if (last != '\\' && last != '/')
		filePath->append('\\');
#elif (_AXL_OS_POSIX)
	if (last != '/')
		filePath->append('/');
#endif

	filePath->append(fileName);
	return *filePath;
}